

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_processor.cc
# Opt level: O2

Status __thiscall
sentencepiece::SentencePieceProcessor::CalculateEntropy
          (SentencePieceProcessor *this,string_view input,float alpha,float *entropy)

{
  char cVar1;
  Status *_status;
  size_t sVar2;
  undefined4 *in_R8;
  undefined4 uVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> norm_to_orig;
  string normalized;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_1c8;
  undefined1 *local_1a8;
  undefined8 local_1a0;
  undefined1 local_198 [368];
  
  sVar2 = input._M_len;
  cVar1 = (**(code **)(**(long **)(sVar2 + 8) + 0x68))();
  if (cVar1 == '\0') {
    local_1a8 = (undefined1 *)CONCAT44(local_1a8._4_4_,0xd);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a0);
    std::operator<<((ostream *)&local_1a0,"src/sentencepiece_processor.cc");
    std::operator<<((ostream *)&local_1a0,"(");
    std::ostream::operator<<((ostringstream *)&local_1a0,0x2ef);
    std::operator<<((ostream *)&local_1a0,") [");
    std::operator<<((ostream *)&local_1a0,"model_->IsCalculateEntropyAvailable()");
    std::operator<<((ostream *)&local_1a0,"] ");
    std::operator<<((ostream *)&local_1a0,"CalculateEntropy is not available for the current model."
                   );
    util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a0);
  }
  else {
    local_1a8 = local_198;
    local_1a0 = 0;
    local_198[0] = 0;
    local_1c8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (**(code **)(**(long **)(sVar2 + 0x10) + 0x20))
              (this,*(long **)(sVar2 + 0x10),input._M_str,entropy,&local_1a8);
    if (this->_vptr_SentencePieceProcessor == (_func_int **)0x0) {
      util::Status::~Status((Status *)this);
      uVar3 = (**(code **)(**(long **)(sVar2 + 8) + 0x48))
                        (alpha,*(long **)(sVar2 + 8),local_1a0,local_1a8);
      *in_R8 = uVar3;
      util::Status::Status((Status *)this);
    }
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_1c8);
    std::__cxx11::string::~string((string *)&local_1a8);
  }
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status SentencePieceProcessor::CalculateEntropy(absl::string_view input,
                                                      float alpha,
                                                      float *entropy) const {
  CHECK_OR_RETURN(model_->IsCalculateEntropyAvailable())
      << "CalculateEntropy is not available for the current model.";
  std::string normalized;
  std::vector<size_t> norm_to_orig;
  RETURN_IF_ERROR(normalizer_->Normalize(input, &normalized, &norm_to_orig));

  *entropy = model_->CalculateEntropy(normalized, alpha);
  return util::OkStatus();
}